

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O1

double qpdf_oh_get_numeric_value(qpdf_data qpdf,qpdf_oh oh)

{
  size_t *psVar1;
  undefined1 this [8];
  uint uVar2;
  _Node *p_Var3;
  char *cstr;
  Pipeline *this_00;
  double ret;
  undefined1 local_148 [8];
  undefined1 local_140 [24];
  _Invoker_type p_Stack_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_110;
  _Any_data local_108;
  code *local_f8;
  code *local_f0;
  undefined1 local_e0 [16];
  function<double_(QPDFObjectHandle_&)> local_d0;
  qpdf_oh local_b0;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  undefined8 local_20;
  
  local_48._M_unused._M_object = &local_20;
  local_20 = 0;
  local_48._8_8_ = 0;
  pcStack_30 = std::
               _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:865:12)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:865:12)>
             ::_M_manager;
  local_108._M_unused._M_object = (void *)0x0;
  local_108._8_8_ = 0;
  local_f0 = std::
             _Function_handler<double_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1267:64)>
             ::_M_invoke;
  local_f8 = std::
             _Function_handler<double_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1267:64)>
             ::_M_manager;
  std::function<double_()>::function
            ((function<double_()> *)&local_68,(function<double_()> *)&local_48);
  std::function<double_(QPDFObjectHandle_&)>::function
            (&local_d0,(function<double_(QPDFObjectHandle_&)> *)&local_108);
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  local_98 = (code *)0x0;
  pcStack_90 = (code *)0x0;
  local_b0 = oh;
  local_a8._M_unused._M_object = operator_new(0x28);
  *(undefined8 *)local_a8._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_a8._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_a8._M_unused._0_8_ + 0x10) = 0;
  *(_Invoker_type *)((long)local_a8._M_unused._0_8_ + 0x18) = local_d0._M_invoker;
  if (local_d0.super__Function_base._M_manager != (_Manager_type)0x0) {
    *(void **)local_a8._M_unused._0_8_ =
         local_d0.super__Function_base._M_functor._M_unused._M_object;
    *(undefined8 *)((long)local_a8._M_unused._0_8_ + 8) =
         local_d0.super__Function_base._M_functor._8_8_;
    *(_Manager_type *)((long)local_a8._M_unused._0_8_ + 0x10) =
         local_d0.super__Function_base._M_manager;
    local_d0.super__Function_base._M_manager = (_Manager_type)0x0;
    local_d0._M_invoker = (_Invoker_type)0x0;
  }
  *(qpdf_oh *)((long)local_a8._M_unused._0_8_ + 0x20) = oh;
  pcStack_90 = std::
               _Function_handler<double_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:919:48)>
               ::_M_invoke;
  local_98 = std::
             _Function_handler<double_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:919:48)>
             ::_M_manager;
  local_148 = (undefined1  [8])local_e0;
  std::function<double_(_qpdf_data_*)>::function
            ((function<double_(_qpdf_data_*)> *)local_140,
             (function<double_(_qpdf_data_*)> *)&local_a8);
  local_78 = (code *)0x0;
  pcStack_70 = (code *)0x0;
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_88._M_unused._M_object = operator_new(0x28);
  *(undefined1 (*) [8])local_88._M_unused._0_8_ = local_148;
  *(long *)((long)local_88._M_unused._0_8_ + 8) = 0;
  *(long *)((long)local_88._M_unused._0_8_ + 0x10) = 0;
  *(long *)((long)local_88._M_unused._0_8_ + 0x18) = 0;
  *(_Invoker_type *)((long)local_88._M_unused._0_8_ + 0x20) = p_Stack_128;
  if ((code *)local_140._16_8_ != (code *)0x0) {
    *(undefined8 *)((long)local_88._M_unused._0_8_ + 8) = local_140._0_8_;
    *(undefined8 *)((long)local_88._M_unused._0_8_ + 0x10) = local_140._8_8_;
    *(undefined8 *)((long)local_88._M_unused._0_8_ + 0x18) = local_140._16_8_;
    local_140._16_8_ = (code *)0x0;
    p_Stack_128 = (_Invoker_type)0x0;
  }
  pcStack_70 = std::
               _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:811:48)>
               ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:811:48)>
             ::_M_manager;
  uVar2 = trap_errors(qpdf,(function<void_(_qpdf_data_*)> *)&local_88);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  if ((code *)local_140._16_8_ != (code *)0x0) {
    (*(code *)local_140._16_8_)
              ((function<double_(_qpdf_data_*)> *)local_140,
               (function<double_(_qpdf_data_*)> *)local_140,3);
  }
  if (uVar2 < 2) {
    local_120._M_allocated_capacity = local_e0._0_8_;
  }
  else {
    if (qpdf->silence_errors == false) {
      if (qpdf->oh_error_occurred == false) {
        local_120._8_4_ = 1;
        QPDF::getFilename_abi_cxx11_
                  ((string *)local_148,
                   (qpdf->qpdf).super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        local_e0._12_4_ = 0;
        p_Var3 = std::__cxx11::list<QPDFExc,std::allocator<QPDFExc>>::
                 _M_create_node<qpdf_error_code_e,std::__cxx11::string,char_const(&)[1],int,char_const(&)[129]>
                           ((list<QPDFExc,std::allocator<QPDFExc>> *)&qpdf->warnings,
                            (qpdf_error_code_e *)(local_120._M_local_buf + 8),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_148,(char (*) [1])0x27ecae,(int *)(local_e0 + 0xc),
                            (char (*) [129])
                            "C API function caught an exception that it isn\'t returning; please point the application developer to ERROR HANDLING in qpdf-c.h"
                           );
        std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
        psVar1 = &(qpdf->warnings).super__List_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 + 1;
        if (local_148 != (undefined1  [8])(local_140 + 8)) {
          operator_delete((void *)local_148,local_140._8_8_ + 1);
        }
        qpdf->oh_error_occurred = true;
      }
      QPDFLogger::defaultLogger();
      QPDFLogger::getError((QPDFLogger *)local_148,SUB41(local_120._8_4_,0));
      this = local_148;
      cstr = (char *)(**(code **)(*(long *)(qpdf->error).
                                           super___shared_ptr<QPDFExc,_(__gnu_cxx::_Lock_policy)2>.
                                           _M_ptr + 0x10))();
      this_00 = Pipeline::operator<<((Pipeline *)this,cstr);
      Pipeline::operator<<(this_00,"\n");
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._0_8_);
      }
      if (local_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_110);
      }
    }
    if (local_58 == (code *)0x0) {
      std::__throw_bad_function_call();
    }
    local_120._M_allocated_capacity = (size_type)(*local_50)(&local_68);
  }
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
  }
  if (local_d0.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_d0.super__Function_base._M_manager)(&local_d0,&local_d0,3);
  }
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  if (local_f8 != (code *)0x0) {
    (*local_f8)(&local_108,&local_108,__destroy_functor);
  }
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  return (double)(_func_int **)local_120._M_allocated_capacity;
}

Assistant:

double
qpdf_oh_get_numeric_value(qpdf_data qpdf, qpdf_oh oh)
{
    return do_with_oh<double>(qpdf, oh, return_T<double>(0.0), [](QPDFObjectHandle& o) {
        QTC::TC("qpdf", "qpdf-c called qpdf_oh_get_numeric_value");
        return o.getNumericValue();
    });
}